

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt.c
# Opt level: O2

int crypt_encrypt_chacha20_poly_buffer
              (LIBSSH2_SESSION *session,uint seqno,uchar *buf,size_t buf_len,void **abstract,
              int firstlast)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  
  piVar1 = (int *)*abstract;
  uVar3 = 1;
  if (piVar1 != (int *)0x0) {
    if (*piVar1 == 0) {
      iVar2 = chachapoly_crypt((chachapoly_ctx *)(piVar1 + 6),seqno,buf,buf,(u_int)buf_len,4,0);
      if (iVar2 == 0) {
        memmove(buf,buf + 4,buf_len - 4);
        uVar3 = 0;
      }
    }
    else {
      iVar2 = chachapoly_crypt((chachapoly_ctx *)(piVar1 + 6),seqno,buf,buf,(u_int)buf_len - 4,4,
                               *piVar1);
      uVar3 = (uint)(iVar2 != 0);
    }
  }
  return uVar3;
}

Assistant:

static int
crypt_encrypt_chacha20_poly_buffer(LIBSSH2_SESSION * session,
                                   unsigned int seqno,
                                   unsigned char *buf,
                                   size_t buf_len,
                                   void **abstract,
                                   int firstlast)
{
    int ret = 1;
    struct crypt_ctx *ctx = *(struct crypt_ctx **) abstract;

    (void)session;
    (void)firstlast;

    if(ctx) {
        if(ctx->encrypt) {
            /* requires out_buf to be large enough to hold encrypted output
               plus auth tag (auth len)

               buf is a full packet so we need to subtract packet length from
               length
             */
            ret = chachapoly_crypt(&ctx->chachapoly_ctx, seqno, buf, buf,
                                   ((u_int)buf_len) - 4, 4, ctx->encrypt);
        }
        else {
            /* buf is full packet including size and auth tag but buf_len
               doesn't include size */
            ret = chachapoly_crypt(&ctx->chachapoly_ctx, seqno, buf, buf,
                                   ((u_int)buf_len), 4, ctx->encrypt);

            /* the api expects the size field to already be removed
               from the decrypted packet so we'll help it out */
            if(ret == 0) {
                memmove(buf, buf + 4, buf_len - 4);
            }
        }
    }

    return (ret == 0 ? 0 : 1);
}